

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

QString * __thiscall
CPP::WriteInitialization::disableSorting(WriteInitialization *this,DomWidget *w,QString *varName)

{
  long lVar1;
  QLatin1StringView latin1;
  bool bVar2;
  Language LVar3;
  QTextStream *pQVar4;
  QString *in_RCX;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar5;
  QString *tempName;
  DomWidget *in_stack_ffffffffffffff18;
  QString *this_00;
  QString *this_01;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar6;
  QString *className;
  QString *instanceName;
  Driver *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = 0;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this_01 = in_RDI;
  className = in_RSI;
  instanceName = in_RDI;
  QString::QString((QString *)0x13f011);
  DomWidget::elementItem(in_stack_ffffffffffffff18);
  bVar2 = QList<DomItem_*>::isEmpty((QList<DomItem_*> *)0x13f030);
  QList<DomItem_*>::~QList((QList<DomItem_*> *)0x13f043);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    this_00 = (QString *)(in_RSI->d).size;
    QVar5 = Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)this_00);
    latin1.m_data._0_7_ = in_stack_ffffffffffffff58;
    latin1.m_size = (qsizetype)QVar5.m_data;
    latin1.m_data._7_1_ = uVar6;
    QString::QString(this_01,latin1);
    QString::QString((QString *)0x13f09d);
    Driver::unique(in_stack_ffffffffffffff80,instanceName,className);
    QString::operator=(this_00,&in_stack_ffffffffffffff18->m_attr_class);
    QString::~QString((QString *)0x13f0de);
    QString::~QString((QString *)0x13f0eb);
    QString::~QString((QString *)0x13f0f8);
    QTextStream::operator<<((QTextStream *)&in_RSI[0x13].d.size,"\n");
    QTextStream::operator<<((QTextStream *)&in_RSI[0x13].d.size,(QString *)&in_RSI[1].d.size);
    LVar3 = language::language();
    if (LVar3 == Cpp) {
      QTextStream::operator<<((QTextStream *)&in_RSI[0x13].d.size,"const bool ");
    }
    pQVar4 = (QTextStream *)QTextStream::operator<<((QTextStream *)&in_RSI[0x13].d.size,in_RDI);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4," = ");
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,in_RCX);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)language::derefPointer);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,"isSortingEnabled()");
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)language::eol);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)&in_RSI[1].d.size);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,in_RCX);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)language::derefPointer);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,"setSortingEnabled(");
    language::boolValue(SUB81((ulong)this_01 >> 0x38,0));
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)&stack0xffffffffffffff80);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,')');
    QTextStream::operator<<(pQVar4,(QString *)language::eol);
    QString::~QString((QString *)0x13f229);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

QString WriteInitialization::disableSorting(DomWidget *w, const QString &varName)
{
    // turn off sortingEnabled to force programmatic item order (setItem())
    QString tempName;
    if (!w->elementItem().isEmpty()) {
        tempName = m_driver->unique("__sortingEnabled"_L1);
        m_refreshOut << "\n";
        m_refreshOut << m_indent;
        if (language::language() == Language::Cpp)
            m_refreshOut << "const bool ";
        m_refreshOut << tempName << " = " << varName << language::derefPointer
            << "isSortingEnabled()" << language::eol
            << m_indent << varName << language::derefPointer
            << "setSortingEnabled(" << language::boolValue(false) << ')' << language::eol;
    }
    return tempName;
}